

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O3

void av1_compute_stats_highbd_avx2
               (int wiener_win,uint8_t *dgd8,uint8_t *src8,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,aom_bit_depth_t bit_depth)

{
  undefined1 (*pauVar1) [16];
  long *plVar2;
  undefined4 uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [32];
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long *plVar17;
  undefined1 (*pauVar18) [32];
  int iVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  int *piVar30;
  int64_t *piVar31;
  long lVar32;
  ulong uVar33;
  int *piVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int64_t *piVar41;
  uint uVar42;
  long lVar43;
  ulong uVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  int64_t M_int [7] [7];
  int64_t H_int [49] [56];
  long local_5930;
  long local_5900;
  long local_58f8;
  int local_58a0 [24];
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 local_5820;
  undefined8 uStack_5818;
  undefined8 uStack_5810;
  undefined8 uStack_5808;
  undefined8 local_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  undefined4 local_57e0;
  long local_57c0 [52];
  undefined1 local_5620 [288];
  undefined1 local_5500 [128];
  undefined1 local_5480 [21584];
  
  if (wiener_win == 5) {
    lVar16 = (long)dgd8 * 2;
    iVar19 = 0;
    if (v_start < v_end) {
      lVar35 = (long)v_start;
      lVar40 = lVar16 + dgd_stride * lVar35 * 2;
      uVar9 = 0;
      do {
        lVar43 = (long)h_start;
        if (h_start < h_end) {
          do {
            uVar9 = uVar9 + *(ushort *)(lVar40 + lVar43 * 2);
            lVar43 = lVar43 + 1;
          } while (h_end != lVar43);
        }
        lVar35 = lVar35 + 1;
        lVar40 = lVar40 + (long)dgd_stride * 2;
      } while (lVar35 != v_end);
    }
    else {
      uVar9 = 0;
    }
    uVar44 = (ulong)((v_end - v_start) * (h_end - h_start));
    local_57c0[0x14] = 0;
    local_57c0[0x15] = 0;
    local_57c0[0x16] = 0;
    local_57c0[0x17] = 0;
    local_57c0[0x10] = 0;
    local_57c0[0x11] = 0;
    local_57c0[0x12] = 0;
    local_57c0[0x13] = 0;
    local_57c0[0xc] = 0;
    local_57c0[0xd] = 0;
    local_57c0[0xe] = 0;
    local_57c0[0xf] = 0;
    local_57c0[8] = 0;
    local_57c0[9] = 0;
    local_57c0[10] = 0;
    local_57c0[0xb] = 0;
    local_57c0[4] = 0;
    local_57c0[5] = 0;
    local_57c0[6] = 0;
    local_57c0[7] = 0;
    local_57c0[0] = 0;
    local_57c0[1] = 0;
    local_57c0[2] = 0;
    local_57c0[3] = 0;
    local_57c0[0x18] = 0;
    memset(local_5620,0,8000);
    local_58a0[0x10] = 0;
    local_58a0[0x11] = 0;
    local_58a0[0x12] = 0;
    local_58a0[0x13] = 0;
    local_58a0[0x14] = 0;
    local_58a0[0x15] = 0;
    local_58a0[0x16] = 0;
    local_58a0[0x17] = 0;
    local_58a0[8] = 0;
    local_58a0[9] = 0;
    local_58a0[10] = 0;
    local_58a0[0xb] = 0;
    local_58a0[0xc] = 0;
    local_58a0[0xd] = 0;
    local_58a0[0xe] = 0;
    local_58a0[0xf] = 0;
    local_58a0[0] = 0;
    local_58a0[1] = 0;
    local_58a0[2] = 0;
    local_58a0[3] = 0;
    local_58a0[4] = 0;
    local_58a0[5] = 0;
    local_58a0[6] = 0;
    local_58a0[7] = 0;
    local_5840 = (ulong)local_5840._4_4_ << 0x20;
    if (v_start < v_end) {
      lVar35 = (long)(dgd_stride * 2);
      lVar11 = (long)dgd_stride;
      lVar43 = (long)(dgd_stride * 3);
      lVar38 = (long)(dgd_stride << 2);
      lVar12 = (long)v_start;
      local_58f8 = (long)h_start * 2 + lVar11 * lVar12 * 2 + lVar35 * -2 + -2 + lVar16;
      local_5930 = lVar11 * lVar12 * 2 + lVar35 * -2 + lVar16 + -4;
      lVar40 = lVar11 * 2;
      iVar19 = 0;
      do {
        iVar27 = (int)lVar12;
        uVar8 = v_end - iVar27;
        if (uVar8 != 0 && iVar27 <= v_end) {
          if (0x3f < uVar8) {
            uVar8 = 0x40;
          }
          lVar28 = lVar12;
          lVar32 = local_5930;
          lVar15 = local_58f8;
          do {
            lVar23 = lVar16 + lVar35 * -2 + -4 + lVar28 * lVar11 * 2;
            lVar37 = (long)src8 * 2 + lVar28 * src_stride * 2;
            uVar33 = (long)h_start;
            lVar14 = lVar15;
            if (h_start < (int)(h_end & 0xfffffffeU)) {
              do {
                uVar4 = *(ushort *)(lVar37 + uVar33 * 2);
                uVar5 = *(ushort *)(lVar37 + 2 + uVar33 * 2);
                pauVar1 = (undefined1 (*) [16])(lVar23 + uVar33 * 2);
                auVar47._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + 8) + ZEXT116(1) * *pauVar1;
                auVar47._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + 8);
                auVar47 = vpshufb_avx2(auVar47,_DAT_0050f2e0);
                auVar51._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2);
                auVar51._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8);
                auVar51 = vpshufb_avx2(auVar51,_DAT_0050f2e0);
                auVar55._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar35 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar35 * 2);
                auVar55._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar35 * 2 + 8);
                auVar55 = vpshufb_avx2(auVar55,_DAT_0050f2e0);
                auVar59._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar43 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar43 * 2);
                auVar59._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar43 * 2 + 8);
                auVar59 = vpshufb_avx2(auVar59,_DAT_0050f2e0);
                auVar63._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar38 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar38 * 2);
                auVar63._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar38 * 2 + 8);
                auVar63 = vpshufb_avx2(auVar63,_DAT_0050f2e0);
                pauVar18 = (undefined1 (*) [32])local_5500;
                piVar30 = local_58a0;
                plVar17 = local_57c0;
                lVar13 = 0;
                lVar36 = lVar14;
                do {
                  uVar42 = (uint)*(ushort *)(*pauVar1 + lVar13 * lVar11 * 2);
                  lVar22 = 0;
                  pauVar10 = pauVar18;
                  do {
                    uVar6 = *(ushort *)(lVar36 + lVar22);
                    piVar34 = (int *)((long)piVar30 + lVar22 * 2);
                    *piVar34 = *piVar34 + uVar6 + uVar42;
                    uVar21 = (uint)uVar4;
                    uVar20 = (uint)uVar5;
                    plVar2 = (long *)((long)plVar17 + lVar22 * 4);
                    *plVar2 = *plVar2 + (ulong)(uVar6 * uVar20 + uVar42 * uVar21);
                    uVar42 = *(uint *)(lVar36 + -2 + lVar22);
                    auVar67._4_4_ = uVar42;
                    auVar67._0_4_ = uVar42;
                    auVar67._8_4_ = uVar42;
                    auVar67._12_4_ = uVar42;
                    auVar67._16_4_ = uVar42;
                    auVar67._20_4_ = uVar42;
                    auVar67._24_4_ = uVar42;
                    auVar67._28_4_ = uVar42;
                    auVar52 = vpmaddwd_avx2(auVar67,auVar47);
                    auVar48 = vpmovzxdq_avx2(auVar52._0_16_);
                    auVar48 = vpaddq_avx2(auVar48,pauVar10[-9]);
                    pauVar10[-9] = auVar48;
                    auVar48 = vpmovzxdq_avx2(auVar52._16_16_);
                    auVar48 = vpaddq_avx2(auVar48,pauVar10[-8]);
                    pauVar10[-8] = auVar48;
                    auVar52 = vpmaddwd_avx2(auVar67,auVar51);
                    auVar48 = vpmovzxdq_avx2(auVar52._0_16_);
                    auVar48 = vpaddq_avx2(auVar48,pauVar10[-7]);
                    pauVar10[-7] = auVar48;
                    auVar48 = vpmovzxdq_avx2(auVar52._16_16_);
                    auVar48 = vpaddq_avx2(auVar48,pauVar10[-6]);
                    pauVar10[-6] = auVar48;
                    auVar52 = vpmaddwd_avx2(auVar67,auVar55);
                    auVar48 = vpmovzxdq_avx2(auVar52._0_16_);
                    auVar48 = vpaddq_avx2(auVar48,pauVar10[-5]);
                    pauVar10[-5] = auVar48;
                    auVar48 = vpmovzxdq_avx2(auVar52._16_16_);
                    auVar48 = vpaddq_avx2(auVar48,pauVar10[-4]);
                    pauVar10[-4] = auVar48;
                    auVar52 = vpmaddwd_avx2(auVar67,auVar59);
                    auVar48 = vpmovzxdq_avx2(auVar52._0_16_);
                    auVar48 = vpaddq_avx2(auVar48,pauVar10[-3]);
                    pauVar10[-3] = auVar48;
                    auVar48 = vpmovzxdq_avx2(auVar52._16_16_);
                    auVar48 = vpaddq_avx2(auVar48,pauVar10[-2]);
                    pauVar10[-2] = auVar48;
                    auVar52 = vpmaddwd_avx2(auVar67,auVar63);
                    auVar48 = vpmovzxdq_avx2(auVar52._0_16_);
                    auVar48 = vpaddq_avx2(auVar48,pauVar10[-1]);
                    pauVar10[-1] = auVar48;
                    auVar48 = vpmovzxdq_avx2(auVar52._16_16_);
                    auVar48 = vpaddq_avx2(auVar48,*pauVar10);
                    *pauVar10 = auVar48;
                    uVar42 = uVar42 >> 0x10;
                    lVar22 = lVar22 + 2;
                    pauVar10 = pauVar10 + 0x32;
                  } while (lVar22 != 10);
                  lVar13 = lVar13 + 1;
                  plVar17 = plVar17 + 5;
                  piVar30 = piVar30 + 5;
                  lVar36 = lVar36 + lVar40;
                  pauVar18 = pauVar18 + 10;
                } while (lVar13 != 5);
                iVar19 = iVar19 + uVar21 + uVar20;
                uVar33 = uVar33 + 2;
                lVar14 = lVar14 + 4;
              } while ((long)uVar33 < (long)(int)(h_end & 0xfffffffeU));
            }
            else {
              uVar33 = (ulong)(uint)h_start;
            }
            if ((h_end & 1U) != 0) {
              lVar14 = (long)(int)uVar33;
              uVar4 = *(ushort *)(lVar37 + lVar14 * 2);
              pauVar1 = (undefined1 (*) [16])(lVar23 + lVar14 * 2);
              auVar48._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + 8) + ZEXT116(1) * *pauVar1;
              auVar48._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + 8);
              auVar47 = vpshufb_avx2(auVar48,_DAT_0050f2e0);
              auVar52._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2);
              auVar52._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8);
              auVar51 = vpshufb_avx2(auVar52,_DAT_0050f2e0);
              auVar56._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar35 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar35 * 2);
              auVar56._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar35 * 2 + 8);
              auVar55 = vpshufb_avx2(auVar56,_DAT_0050f2e0);
              auVar60._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar43 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar43 * 2);
              auVar60._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar43 * 2 + 8);
              auVar59 = vpshufb_avx2(auVar60,_DAT_0050f2e0);
              auVar64._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar38 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar38 * 2);
              auVar64._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar38 * 2 + 8);
              auVar63 = vpshufb_avx2(auVar64,_DAT_0050f2e0);
              lVar23 = lVar32 + lVar14 * 2;
              pauVar18 = (undefined1 (*) [32])local_5500;
              piVar30 = local_58a0;
              plVar17 = local_57c0;
              lVar37 = 0;
              do {
                lVar14 = 0;
                pauVar10 = pauVar18;
                do {
                  uVar5 = *(ushort *)(lVar23 + lVar14);
                  piVar34 = (int *)((long)piVar30 + lVar14 * 2);
                  *piVar34 = *piVar34 + CONCAT22(0,uVar5);
                  uVar42 = (uint)uVar4;
                  plVar2 = (long *)((long)plVar17 + lVar14 * 4);
                  *plVar2 = *plVar2 + (ulong)(uVar5 * uVar42);
                  auVar68._4_2_ = uVar5;
                  auVar68._0_4_ = CONCAT22(0,uVar5);
                  auVar68._6_2_ = 0;
                  auVar68._8_2_ = uVar5;
                  auVar68._10_2_ = 0;
                  auVar68._12_2_ = uVar5;
                  auVar68._14_2_ = 0;
                  auVar68._16_2_ = uVar5;
                  auVar68._18_2_ = 0;
                  auVar68._20_2_ = uVar5;
                  auVar68._22_2_ = 0;
                  auVar68._24_2_ = uVar5;
                  auVar68._26_2_ = 0;
                  auVar68._28_2_ = uVar5;
                  auVar68._30_2_ = 0;
                  auVar52 = vpmaddwd_avx2(auVar68,auVar47);
                  auVar48 = vpmovzxdq_avx2(auVar52._0_16_);
                  auVar48 = vpaddq_avx2(auVar48,pauVar10[-9]);
                  pauVar10[-9] = auVar48;
                  auVar48 = vpmovzxdq_avx2(auVar52._16_16_);
                  auVar48 = vpaddq_avx2(auVar48,pauVar10[-8]);
                  pauVar10[-8] = auVar48;
                  auVar52 = vpmaddwd_avx2(auVar68,auVar51);
                  auVar48 = vpmovzxdq_avx2(auVar52._0_16_);
                  auVar48 = vpaddq_avx2(auVar48,pauVar10[-7]);
                  pauVar10[-7] = auVar48;
                  auVar48 = vpmovzxdq_avx2(auVar52._16_16_);
                  auVar48 = vpaddq_avx2(auVar48,pauVar10[-6]);
                  pauVar10[-6] = auVar48;
                  auVar52 = vpmaddwd_avx2(auVar68,auVar55);
                  auVar48 = vpmovzxdq_avx2(auVar52._0_16_);
                  auVar48 = vpaddq_avx2(auVar48,pauVar10[-5]);
                  pauVar10[-5] = auVar48;
                  auVar48 = vpmovzxdq_avx2(auVar52._16_16_);
                  auVar48 = vpaddq_avx2(auVar48,pauVar10[-4]);
                  pauVar10[-4] = auVar48;
                  auVar52 = vpmaddwd_avx2(auVar68,auVar59);
                  auVar48 = vpmovzxdq_avx2(auVar52._0_16_);
                  auVar48 = vpaddq_avx2(auVar48,pauVar10[-3]);
                  pauVar10[-3] = auVar48;
                  auVar48 = vpmovzxdq_avx2(auVar52._16_16_);
                  auVar48 = vpaddq_avx2(auVar48,pauVar10[-2]);
                  pauVar10[-2] = auVar48;
                  auVar52 = vpmaddwd_avx2(auVar68,auVar63);
                  auVar48 = vpmovzxdq_avx2(auVar52._0_16_);
                  auVar48 = vpaddq_avx2(auVar48,pauVar10[-1]);
                  pauVar10[-1] = auVar48;
                  auVar48 = vpmovzxdq_avx2(auVar52._16_16_);
                  auVar48 = vpaddq_avx2(auVar48,*pauVar10);
                  *pauVar10 = auVar48;
                  lVar14 = lVar14 + 2;
                  pauVar10 = pauVar10 + 0x32;
                } while (lVar14 != 10);
                lVar37 = lVar37 + 1;
                plVar17 = plVar17 + 5;
                piVar30 = piVar30 + 5;
                lVar23 = lVar23 + lVar40;
                pauVar18 = pauVar18 + 10;
              } while (lVar37 != 5);
              iVar19 = iVar19 + uVar42;
            }
            lVar28 = lVar28 + 1;
            lVar15 = lVar15 + lVar40;
            lVar32 = lVar32 + lVar40;
          } while (lVar28 < (int)(uVar8 + iVar27));
        }
        lVar12 = lVar12 + 0x40;
        local_58f8 = local_58f8 + lVar11 * 0x80;
        local_5930 = local_5930 + lVar11 * 0x80;
      } while ((int)lVar12 < v_end);
    }
    lVar16 = 0x10;
    if (bit_depth != AOM_BITS_12) {
      lVar16 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
    }
    uVar9 = uVar9 / uVar44 & 0xffff;
    lVar35 = uVar44 * uVar9 * uVar9;
    lVar40 = 0;
    puVar26 = local_5620;
    do {
      lVar43 = 0;
      puVar25 = puVar26;
      piVar31 = H;
      do {
        iVar27 = local_58a0[lVar40 * 5 + lVar43];
        M[lVar43 * 5 + lVar40] =
             (long)((local_57c0[lVar40 * 5 + lVar43] + lVar35) -
                   ((long)iVar27 + (long)iVar19) * uVar9) / lVar16;
        piVar30 = local_58a0;
        lVar38 = 0;
        puVar24 = puVar25;
        piVar41 = piVar31;
        do {
          lVar11 = 0;
          piVar34 = piVar30;
          do {
            *(long *)((long)piVar41 + lVar11) =
                 (long)((*(long *)(puVar24 + lVar11 * 8) + lVar35) -
                       ((long)*piVar34 + (long)iVar27) * uVar9) / lVar16;
            lVar11 = lVar11 + 8;
            piVar34 = piVar34 + 5;
          } while (lVar11 != 0x28);
          lVar38 = lVar38 + 1;
          piVar41 = piVar41 + 5;
          piVar30 = piVar30 + 1;
          puVar24 = puVar24 + 8;
        } while (lVar38 != 5);
        lVar43 = lVar43 + 1;
        piVar31 = piVar31 + 0x7d;
        puVar25 = puVar25 + 0x640;
      } while (lVar43 != 5);
      lVar40 = lVar40 + 1;
      H = H + 0x19;
      puVar26 = puVar26 + 0x140;
    } while (lVar40 != 5);
  }
  else if (wiener_win == 7) {
    lVar16 = (long)dgd8 * 2;
    lVar40 = (long)dgd_stride;
    if (v_start < v_end) {
      lVar43 = (long)v_start;
      lVar35 = lVar16 + lVar40 * lVar43 * 2;
      uVar9 = 0;
      do {
        lVar38 = (long)h_start;
        if (h_start < h_end) {
          do {
            uVar9 = uVar9 + *(ushort *)(lVar35 + lVar38 * 2);
            lVar38 = lVar38 + 1;
          } while (h_end != lVar38);
        }
        lVar43 = lVar43 + 1;
        lVar35 = lVar35 + lVar40 * 2;
      } while (lVar43 != v_end);
    }
    else {
      uVar9 = 0;
    }
    uVar44 = (ulong)((v_end - v_start) * (h_end - h_start));
    memset(local_57c0,0,0x188);
    memset(local_5620,0,0x55c0);
    local_5800 = 0;
    uStack_57f8 = 0;
    uStack_57f0 = 0;
    uStack_57e8 = 0;
    local_5820 = 0;
    uStack_5818 = 0;
    uStack_5810 = 0;
    uStack_5808 = 0;
    local_5840 = 0;
    uStack_5838 = 0;
    uStack_5830 = 0;
    uStack_5828 = 0;
    local_58a0[0x10] = 0;
    local_58a0[0x11] = 0;
    local_58a0[0x12] = 0;
    local_58a0[0x13] = 0;
    local_58a0[0x14] = 0;
    local_58a0[0x15] = 0;
    local_58a0[0x16] = 0;
    local_58a0[0x17] = 0;
    local_58a0[8] = 0;
    local_58a0[9] = 0;
    local_58a0[10] = 0;
    local_58a0[0xb] = 0;
    local_58a0[0xc] = 0;
    local_58a0[0xd] = 0;
    local_58a0[0xe] = 0;
    local_58a0[0xf] = 0;
    local_58a0[0] = 0;
    local_58a0[1] = 0;
    local_58a0[2] = 0;
    local_58a0[3] = 0;
    local_58a0[4] = 0;
    local_58a0[5] = 0;
    local_58a0[6] = 0;
    local_58a0[7] = 0;
    local_57e0 = 0;
    iVar19 = 0;
    if (v_start < v_end) {
      lVar28 = (long)v_start;
      lVar43 = (long)(dgd_stride * 3);
      lVar32 = (long)(dgd_stride * 2);
      lVar11 = (long)(dgd_stride * 4);
      lVar12 = (long)(dgd_stride * 5);
      lVar38 = (long)(dgd_stride * 6);
      local_5930 = (long)h_start * 2 + lVar40 * lVar28 * 2 + lVar43 * -2 + -6 + lVar16;
      local_5900 = lVar40 * lVar28 * 2 + lVar43 * -2 + lVar16 + -6;
      lVar35 = lVar40 * 2;
      iVar19 = 0;
      do {
        iVar27 = (int)lVar28;
        uVar8 = v_end - iVar27;
        if (uVar8 != 0 && iVar27 <= v_end) {
          if (0x3f < uVar8) {
            uVar8 = 0x40;
          }
          lVar15 = lVar28;
          lVar23 = local_5930;
          lVar37 = local_5900;
          do {
            lVar14 = lVar16 + lVar43 * -2 + -6 + lVar15 * lVar40 * 2;
            lVar36 = (long)src8 * 2 + lVar15 * src_stride * 2;
            lVar13 = lVar23;
            uVar33 = (long)h_start;
            if (h_start < (int)(h_end & 0xfffffffeU)) {
              do {
                uVar4 = *(ushort *)(lVar36 + uVar33 * 2);
                uVar5 = *(ushort *)(lVar36 + 2 + uVar33 * 2);
                pauVar1 = (undefined1 (*) [16])(lVar14 + uVar33 * 2);
                auVar45._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + 8) + ZEXT116(1) * *pauVar1;
                auVar45._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + 8);
                auVar47 = vpshufb_avx2(auVar45,_DAT_0050f2e0);
                auVar49._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar40 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar40 * 2);
                auVar49._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar40 * 2 + 8);
                auVar51 = vpshufb_avx2(auVar49,_DAT_0050f2e0);
                auVar53._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar32 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar32 * 2);
                auVar53._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar32 * 2 + 8);
                auVar55 = vpshufb_avx2(auVar53,_DAT_0050f2e0);
                auVar57._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar43 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar43 * 2);
                auVar57._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar43 * 2 + 8);
                auVar59 = vpshufb_avx2(auVar57,_DAT_0050f2e0);
                auVar61._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2);
                auVar61._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8);
                auVar63 = vpshufb_avx2(auVar61,_DAT_0050f2e0);
                auVar65._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar12 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar12 * 2);
                auVar65._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar12 * 2 + 8);
                auVar48 = vpshufb_avx2(auVar65,_DAT_0050f2e0);
                auVar69._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar38 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar38 * 2);
                auVar69._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar38 * 2 + 8);
                auVar52 = vpshufb_avx2(auVar69,_DAT_0050f2e0);
                pauVar18 = (undefined1 (*) [32])local_5480;
                piVar30 = local_58a0;
                plVar17 = local_57c0;
                lVar39 = 0;
                lVar22 = lVar13;
                do {
                  lVar29 = 0;
                  pauVar10 = pauVar18;
                  do {
                    uVar6 = *(ushort *)(lVar22 + lVar29);
                    uVar7 = *(ushort *)(lVar22 + 2 + lVar29);
                    piVar34 = (int *)((long)piVar30 + lVar29 * 2);
                    *piVar34 = *piVar34 + (uint)uVar7 + (uint)uVar6;
                    uVar20 = (uint)uVar4;
                    uVar42 = (uint)uVar5;
                    plVar2 = (long *)((long)plVar17 + lVar29 * 4);
                    *plVar2 = *plVar2 + (ulong)(uVar7 * uVar42 + uVar6 * uVar20);
                    uVar3 = *(undefined4 *)(lVar22 + lVar29);
                    auVar71._4_4_ = uVar3;
                    auVar71._0_4_ = uVar3;
                    auVar71._8_4_ = uVar3;
                    auVar71._12_4_ = uVar3;
                    auVar71._16_4_ = uVar3;
                    auVar71._20_4_ = uVar3;
                    auVar71._24_4_ = uVar3;
                    auVar71._28_4_ = uVar3;
                    auVar56 = vpmaddwd_avx2(auVar71,auVar47);
                    auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-0xd]);
                    pauVar10[-0xd] = auVar67;
                    auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-0xc]);
                    pauVar10[-0xc] = auVar67;
                    auVar56 = vpmaddwd_avx2(auVar71,auVar51);
                    auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-0xb]);
                    pauVar10[-0xb] = auVar67;
                    auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-10]);
                    pauVar10[-10] = auVar67;
                    auVar56 = vpmaddwd_avx2(auVar71,auVar55);
                    auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-9]);
                    pauVar10[-9] = auVar67;
                    auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-8]);
                    pauVar10[-8] = auVar67;
                    auVar56 = vpmaddwd_avx2(auVar71,auVar59);
                    auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-7]);
                    pauVar10[-7] = auVar67;
                    auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-6]);
                    pauVar10[-6] = auVar67;
                    auVar56 = vpmaddwd_avx2(auVar71,auVar63);
                    auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-5]);
                    pauVar10[-5] = auVar67;
                    auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-4]);
                    pauVar10[-4] = auVar67;
                    auVar56 = vpmaddwd_avx2(auVar71,auVar48);
                    auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-3]);
                    pauVar10[-3] = auVar67;
                    auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-2]);
                    pauVar10[-2] = auVar67;
                    auVar56 = vpmaddwd_avx2(auVar71,auVar52);
                    auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                    auVar67 = vpaddq_avx2(auVar67,pauVar10[-1]);
                    pauVar10[-1] = auVar67;
                    auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                    auVar67 = vpaddq_avx2(auVar67,*pauVar10);
                    *pauVar10 = auVar67;
                    lVar29 = lVar29 + 2;
                    pauVar10 = pauVar10 + 0x62;
                  } while (lVar29 != 0xe);
                  lVar39 = lVar39 + 1;
                  plVar17 = plVar17 + 7;
                  piVar30 = piVar30 + 7;
                  lVar22 = lVar22 + lVar35;
                  pauVar18 = pauVar18 + 0xe;
                } while (lVar39 != 7);
                iVar19 = iVar19 + uVar20 + uVar42;
                uVar33 = uVar33 + 2;
                lVar13 = lVar13 + 4;
              } while ((long)uVar33 < (long)(int)(h_end & 0xfffffffeU));
            }
            else {
              uVar33 = (ulong)(uint)h_start;
            }
            if ((h_end & 1U) != 0) {
              lVar13 = (long)(int)uVar33;
              uVar4 = *(ushort *)(lVar36 + lVar13 * 2);
              pauVar1 = (undefined1 (*) [16])(lVar14 + lVar13 * 2);
              auVar46._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + 8) + ZEXT116(1) * *pauVar1;
              auVar46._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + 8);
              auVar47 = vpshufb_avx2(auVar46,_DAT_0050f2e0);
              auVar50._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar40 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar40 * 2);
              auVar50._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar40 * 2 + 8);
              auVar51 = vpshufb_avx2(auVar50,_DAT_0050f2e0);
              auVar54._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar32 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar32 * 2);
              auVar54._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar32 * 2 + 8);
              auVar55 = vpshufb_avx2(auVar54,_DAT_0050f2e0);
              auVar58._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar43 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar43 * 2);
              auVar58._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar43 * 2 + 8);
              auVar59 = vpshufb_avx2(auVar58,_DAT_0050f2e0);
              auVar62._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2);
              auVar62._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8);
              auVar63 = vpshufb_avx2(auVar62,_DAT_0050f2e0);
              auVar66._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar12 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar12 * 2);
              auVar66._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar12 * 2 + 8);
              auVar48 = vpshufb_avx2(auVar66,_DAT_0050f2e0);
              auVar70._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar38 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar38 * 2);
              auVar70._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar38 * 2 + 8);
              auVar52 = vpshufb_avx2(auVar70,_DAT_0050f2e0);
              lVar14 = lVar37 + lVar13 * 2;
              pauVar18 = (undefined1 (*) [32])local_5480;
              piVar30 = local_58a0;
              plVar17 = local_57c0;
              lVar36 = 0;
              do {
                lVar13 = 0;
                pauVar10 = pauVar18;
                do {
                  uVar5 = *(ushort *)(lVar14 + lVar13);
                  piVar34 = (int *)((long)piVar30 + lVar13 * 2);
                  *piVar34 = *piVar34 + CONCAT22(0,uVar5);
                  uVar42 = (uint)uVar4;
                  plVar2 = (long *)((long)plVar17 + lVar13 * 4);
                  *plVar2 = *plVar2 + (ulong)(uVar5 * uVar42);
                  auVar72._4_2_ = uVar5;
                  auVar72._0_4_ = CONCAT22(0,uVar5);
                  auVar72._6_2_ = 0;
                  auVar72._8_2_ = uVar5;
                  auVar72._10_2_ = 0;
                  auVar72._12_2_ = uVar5;
                  auVar72._14_2_ = 0;
                  auVar72._16_2_ = uVar5;
                  auVar72._18_2_ = 0;
                  auVar72._20_2_ = uVar5;
                  auVar72._22_2_ = 0;
                  auVar72._24_2_ = uVar5;
                  auVar72._26_2_ = 0;
                  auVar72._28_2_ = uVar5;
                  auVar72._30_2_ = 0;
                  auVar56 = vpmaddwd_avx2(auVar72,auVar47);
                  auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-0xd]);
                  pauVar10[-0xd] = auVar67;
                  auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-0xc]);
                  pauVar10[-0xc] = auVar67;
                  auVar56 = vpmaddwd_avx2(auVar72,auVar51);
                  auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-0xb]);
                  pauVar10[-0xb] = auVar67;
                  auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-10]);
                  pauVar10[-10] = auVar67;
                  auVar56 = vpmaddwd_avx2(auVar72,auVar55);
                  auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-9]);
                  pauVar10[-9] = auVar67;
                  auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-8]);
                  pauVar10[-8] = auVar67;
                  auVar56 = vpmaddwd_avx2(auVar72,auVar59);
                  auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-7]);
                  pauVar10[-7] = auVar67;
                  auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-6]);
                  pauVar10[-6] = auVar67;
                  auVar56 = vpmaddwd_avx2(auVar72,auVar63);
                  auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-5]);
                  pauVar10[-5] = auVar67;
                  auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-4]);
                  pauVar10[-4] = auVar67;
                  auVar56 = vpmaddwd_avx2(auVar72,auVar48);
                  auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-3]);
                  pauVar10[-3] = auVar67;
                  auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-2]);
                  pauVar10[-2] = auVar67;
                  auVar56 = vpmaddwd_avx2(auVar72,auVar52);
                  auVar67 = vpmovzxdq_avx2(auVar56._0_16_);
                  auVar67 = vpaddq_avx2(auVar67,pauVar10[-1]);
                  pauVar10[-1] = auVar67;
                  auVar67 = vpmovzxdq_avx2(auVar56._16_16_);
                  auVar67 = vpaddq_avx2(auVar67,*pauVar10);
                  *pauVar10 = auVar67;
                  lVar13 = lVar13 + 2;
                  pauVar10 = pauVar10 + 0x62;
                } while (lVar13 != 0xe);
                lVar36 = lVar36 + 1;
                plVar17 = plVar17 + 7;
                piVar30 = piVar30 + 7;
                lVar14 = lVar14 + lVar35;
                pauVar18 = pauVar18 + 0xe;
              } while (lVar36 != 7);
              iVar19 = iVar19 + uVar42;
            }
            lVar15 = lVar15 + 1;
            lVar23 = lVar23 + lVar35;
            lVar37 = lVar37 + lVar35;
          } while (lVar15 < (int)(uVar8 + iVar27));
        }
        lVar28 = lVar28 + 0x40;
        local_5930 = local_5930 + lVar40 * 0x80;
        local_5900 = local_5900 + lVar40 * 0x80;
      } while ((int)lVar28 < v_end);
    }
    lVar16 = 0x10;
    if (bit_depth != AOM_BITS_12) {
      lVar16 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
    }
    uVar9 = uVar9 / uVar44 & 0xffff;
    lVar35 = uVar44 * uVar9 * uVar9;
    lVar40 = 0;
    puVar26 = local_5620;
    do {
      lVar43 = 0;
      puVar25 = puVar26;
      piVar31 = H;
      do {
        iVar27 = local_58a0[lVar40 * 7 + lVar43];
        M[lVar43 * 7 + lVar40] =
             (long)((local_57c0[lVar40 * 7 + lVar43] + lVar35) -
                   ((long)iVar19 + (long)iVar27) * uVar9) / lVar16;
        piVar30 = local_58a0;
        lVar38 = 0;
        puVar24 = puVar25;
        piVar41 = piVar31;
        do {
          lVar11 = 0;
          piVar34 = piVar30;
          do {
            *(long *)((long)piVar41 + lVar11) =
                 (long)((*(long *)(puVar24 + lVar11 * 8) + lVar35) -
                       ((long)*piVar34 + (long)iVar27) * uVar9) / lVar16;
            lVar11 = lVar11 + 8;
            piVar34 = piVar34 + 7;
          } while (lVar11 != 0x38);
          lVar38 = lVar38 + 1;
          piVar41 = piVar41 + 7;
          piVar30 = piVar30 + 1;
          puVar24 = puVar24 + 8;
        } while (lVar38 != 7);
        lVar43 = lVar43 + 1;
        piVar31 = piVar31 + 0x157;
        puVar25 = puVar25 + 0xc40;
      } while (lVar43 != 7);
      lVar40 = lVar40 + 1;
      H = H + 0x31;
      puVar26 = puVar26 + 0x1c0;
    } while (lVar40 != 7);
  }
  else {
    av1_compute_stats_highbd_c
              (wiener_win,dgd8,src8,dgd_avg,src_avg,h_start,h_end,v_start,v_end,dgd_stride,
               src_stride,M,H,bit_depth);
  }
  return;
}

Assistant:

void av1_compute_stats_highbd_avx2(int wiener_win, const uint8_t *dgd8,
                                   const uint8_t *src8, int16_t *dgd_avg,
                                   int16_t *src_avg, int h_start, int h_end,
                                   int v_start, int v_end, int dgd_stride,
                                   int src_stride, int64_t *M, int64_t *H,
                                   aom_bit_depth_t bit_depth) {
  if (wiener_win == WIENER_WIN) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win7_opt_avx2(dgd8, src8, h_start, h_end, v_start,
                                       v_end, dgd_stride, src_stride, M, H,
                                       bit_depth);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win5_opt_avx2(dgd8, src8, h_start, h_end, v_start,
                                       v_end, dgd_stride, src_stride, M, H,
                                       bit_depth);
  } else {
    av1_compute_stats_highbd_c(wiener_win, dgd8, src8, dgd_avg, src_avg,
                               h_start, h_end, v_start, v_end, dgd_stride,
                               src_stride, M, H, bit_depth);
  }
}